

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O3

bool bssl::tls13_add_key_update(SSL *ssl,int request_type)

{
  undefined1 *puVar1;
  DTLS1_STATE *pDVar2;
  bool bVar3;
  int iVar4;
  ScopedCBB cbb;
  CBB body_cbb;
  CBB local_80;
  CBB local_50;
  
  if ((ssl->s3->field_0xdd & 1) != 0) {
    return true;
  }
  iVar4 = SSL_is_dtls(ssl);
  if ((iVar4 != 0) && (pDVar2 = ssl->d1, (pDVar2->outgoing_messages).size_ != '\0')) {
    *(ushort *)pDVar2 =
         (ushort)(request_type == 1) * 0x80 + ((ushort)*(undefined4 *)pDVar2 & 0xfe7f) + 0x80;
    return true;
  }
  CBB_zero(&local_80);
  bVar3 = (*ssl->method->init_message)(ssl,&local_80,&local_50,'\x18');
  if ((((bVar3) && (iVar4 = CBB_add_u8(&local_50,(uint8_t)request_type), iVar4 != 0)) &&
      (bVar3 = ssl_add_message_cbb(ssl,&local_80), bVar3)) &&
     ((iVar4 = SSL_is_dtls(ssl), iVar4 != 0 ||
      (bVar3 = tls13_rotate_traffic_key(ssl,evp_aead_seal), bVar3)))) {
    puVar1 = &ssl->s3->field_0xdc;
    *(ushort *)puVar1 = *(ushort *)puVar1 | 0x100;
    bVar3 = true;
    (*ssl->method->finish_flight)(ssl);
  }
  else {
    bVar3 = false;
  }
  CBB_cleanup(&local_80);
  return bVar3;
}

Assistant:

bool tls13_add_key_update(SSL *ssl, int request_type) {
  if (ssl->s3->key_update_pending) {
    return true;
  }

  // We do not support multiple parallel outgoing flights. If there is an
  // outgoing flight pending, queue the KeyUpdate for later.
  if (SSL_is_dtls(ssl) && !ssl->d1->outgoing_messages.empty()) {
    ssl->d1->queued_key_update = request_type == SSL_KEY_UPDATE_REQUESTED
                                     ? QueuedKeyUpdate::kUpdateRequested
                                     : QueuedKeyUpdate::kUpdateNotRequested;
    return true;
  }

  ScopedCBB cbb;
  CBB body_cbb;
  if (!ssl->method->init_message(ssl, cbb.get(), &body_cbb,
                                 SSL3_MT_KEY_UPDATE) ||
      !CBB_add_u8(&body_cbb, request_type) ||
      !ssl_add_message_cbb(ssl, cbb.get())) {
    return false;
  }

  // In DTLS, the actual key update is deferred until KeyUpdate is ACKed.
  if (!SSL_is_dtls(ssl) && !tls13_rotate_traffic_key(ssl, evp_aead_seal)) {
    return false;
  }

  // Suppress KeyUpdate acknowledgments until this change is written to the
  // wire. This prevents us from accumulating write obligations when read and
  // write progress at different rates. See RFC 8446, section 4.6.3.
  ssl->s3->key_update_pending = true;
  ssl->method->finish_flight(ssl);
  return true;
}